

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::BustItemCache(void)

{
  ImPlotContext *this;
  int iVar1;
  ImPlotPlot *pIVar2;
  int p;
  int i;
  
  this = GImPlot;
  i = 0;
  while( true ) {
    iVar1 = ImPool<ImPlotPlot>::GetBufSize(&this->Plots);
    if (iVar1 <= i) break;
    pIVar2 = ImVector<ImPlotPlot>::operator[]((ImVector<ImPlotPlot> *)this,i);
    pIVar2->ColormapIdx = 0;
    ImPool<ImPlotItem>::Clear(&pIVar2->Items);
    ImPlotLegendData::Reset(&pIVar2->LegendData);
    i = i + 1;
  }
  return;
}

Assistant:

void BustItemCache() {
    ImPlotContext& gp = *GImPlot;
    for (int p = 0; p < gp.Plots.GetBufSize(); ++p) {
        ImPlotPlot& plot = *gp.Plots.GetByIndex(p);
        plot.ColormapIdx = 0;
        plot.Items.Clear();
        plot.LegendData.Reset();
    }
}